

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateBaseClass.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::DynamicStateBaseClass::initPipeline(DynamicStateBaseClass *this,VkDevice device)

{
  DeviceInterface *pDVar1;
  StencilOpState _front;
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)14>_> data_00;
  RefData<vk::Handle<(vk::HandleType)18>_> data_01;
  StencilOpState _back;
  VkAllocationCallbacks *pVVar2;
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  ProgramBinary *pPVar4;
  Handle<(vk::HandleType)16> *pHVar5;
  Handle<(vk::HandleType)17> *pHVar6;
  Handle<(vk::HandleType)14> *pHVar7;
  VkPipelineCache local_7a8;
  Move<vk::Handle<(vk::HandleType)18>_> local_7a0;
  RefData<vk::Handle<(vk::HandleType)18>_> local_780;
  allocator<vk::VkDynamicState> local_759;
  vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> local_758;
  DynamicState local_740;
  allocator<unsigned_int> local_705;
  value_type_conflict1 local_704;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_700;
  MultiSampleState local_6e8;
  VkPipelineRasterizationStateCreateInfo local_6a0;
  VkStencilOpState local_660;
  VkStencilOpState local_640;
  VkPipelineDepthStencilStateCreateInfo local_620;
  allocator<vk::VkRect2D> local_5b1;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_5b0;
  allocator<vk::VkViewport> local_591;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_590;
  ViewportState local_578;
  ColorBlendState local_518;
  VkPipelineInputAssemblyStateCreateInfo local_4c8;
  VkPipelineVertexInputStateCreateInfo local_4a8;
  deUint64 local_470;
  VkPipelineShaderStageCreateInfo local_468;
  deUint64 local_438;
  VkPipelineShaderStageCreateInfo local_430;
  deUint64 local_400;
  VkPipelineLayout local_3f8;
  undefined1 local_3f0 [8];
  PipelineCreateInfo pipelineCreateInfo;
  Attachment vkCbAttachmentState;
  RefData<vk::Handle<(vk::HandleType)14>_> local_c8;
  undefined1 local_a8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fs;
  Move<vk::Handle<(vk::HandleType)14>_> local_78;
  RefData<vk::Handle<(vk::HandleType)14>_> local_58;
  undefined1 local_38 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vs;
  VkDevice device_local;
  DynamicStateBaseClass *this_local;
  
  pDVar1 = this->m_vk;
  vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)device;
  pPVar3 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  pPVar4 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&this->m_vertexShaderName);
  ::vk::createShaderModule(&local_78,pDVar1,device,pPVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_58,(Move *)&local_78);
  data.deleter.m_deviceIface._0_4_ = (int)local_58.deleter.m_deviceIface;
  data.object.m_internal = local_58.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_58.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_58.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_58.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_58.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_58.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_38,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_78);
  pVVar2 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  pDVar1 = this->m_vk;
  pPVar3 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  pPVar4 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&this->m_fragmentShaderName);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp,pDVar1,
             (VkDevice)pVVar2,pPVar4,0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_c8,
             (Move *)&vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_c8.deleter.m_deviceIface;
  data_00.object.m_internal = local_c8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_c8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_c8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_c8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_c8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_a8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)14>_> *)
             &vkCbAttachmentState.super_VkPipelineColorBlendAttachmentState.alphaBlendOp);
  Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            ((Attachment *)
             &pipelineCreateInfo.m_multisampleStateSampleMask.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,VK_BLEND_FACTOR_SRC_COLOR,
             VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,VK_BLEND_FACTOR_SRC_COLOR,
             VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  local_3f8.m_internal = pHVar5->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_400 = pHVar6->m_internal;
  Draw::PipelineCreateInfo::PipelineCreateInfo
            ((PipelineCreateInfo *)local_3f0,local_3f8,(VkRenderPass)local_400,0,0);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_38);
  local_438 = pHVar7->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_430,(VkShaderModule)local_438,"main",
             VK_SHADER_STAGE_VERTEX_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_3f0,&local_430);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_a8);
  local_470 = pHVar7->m_internal;
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&local_468,(VkShaderModule)local_470,"main",
             VK_SHADER_STAGE_FRAGMENT_BIT);
  Draw::PipelineCreateInfo::addShader((PipelineCreateInfo *)local_3f0,&local_468);
  local_4a8.sType = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.sType;
  local_4a8._4_4_ =
       *(undefined4 *)
        &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.field_0x4;
  local_4a8.pNext = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.pNext;
  local_4a8.flags = (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.flags;
  local_4a8.vertexBindingDescriptionCount =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       vertexBindingDescriptionCount;
  local_4a8.pVertexBindingDescriptions =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       pVertexBindingDescriptions;
  local_4a8.vertexAttributeDescriptionCount =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       vertexAttributeDescriptionCount;
  local_4a8._36_4_ =
       *(undefined4 *)
        &(this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.field_0x24;
  local_4a8.pVertexAttributeDescriptions =
       (this->m_vertexInputState).super_VkPipelineVertexInputStateCreateInfo.
       pVertexAttributeDescriptions;
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_3f0,&local_4a8);
  Draw::PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)&local_4c8,this->m_topology,0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_3f0,&local_4c8);
  Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
            (&local_518,1,
             (VkPipelineColorBlendAttachmentState *)
             &pipelineCreateInfo.m_multisampleStateSampleMask.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,VK_LOGIC_OP_COPY);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_3f0,&local_518.super_VkPipelineColorBlendStateCreateInfo);
  Draw::PipelineCreateInfo::ColorBlendState::~ColorBlendState(&local_518);
  std::allocator<vk::VkViewport>::allocator(&local_591);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector(&local_590,0,&local_591);
  std::allocator<vk::VkRect2D>::allocator(&local_5b1);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::vector(&local_5b0,0,&local_5b1);
  Draw::PipelineCreateInfo::ViewportState::ViewportState(&local_578,1,&local_590,&local_5b0);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_3f0,&local_578.super_VkPipelineViewportStateCreateInfo);
  Draw::PipelineCreateInfo::ViewportState::~ViewportState(&local_578);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~vector(&local_5b0);
  std::allocator<vk::VkRect2D>::~allocator(&local_5b1);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~vector(&local_590);
  std::allocator<vk::VkViewport>::~allocator(&local_591);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_640,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_660,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = local_640.depthFailOp;
  _front.super_VkStencilOpState.failOp = local_640.failOp;
  _front.super_VkStencilOpState.passOp = local_640.passOp;
  _front.super_VkStencilOpState.compareOp = local_640.compareOp;
  _front.super_VkStencilOpState.compareMask = local_640.compareMask;
  _front.super_VkStencilOpState.writeMask = local_640.writeMask;
  _front.super_VkStencilOpState.reference = local_640.reference;
  _back.super_VkStencilOpState.depthFailOp = local_660.depthFailOp;
  _back.super_VkStencilOpState.failOp = local_660.failOp;
  _back.super_VkStencilOpState.passOp = local_660.passOp;
  _back.super_VkStencilOpState.compareOp = local_660.compareOp;
  _back.super_VkStencilOpState.compareMask = local_660.compareMask;
  _back.super_VkStencilOpState.writeMask = local_660.writeMask;
  _back.super_VkStencilOpState.reference = local_660.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)&local_620,0,0,VK_COMPARE_OP_ALWAYS,0,0,_front,_back,0.0,1.0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_3f0,&local_620);
  Draw::PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)&local_6a0,0,0,VK_POLYGON_MODE_FILL,0,VK_FRONT_FACE_CLOCKWISE,1,0.0,
             0.0,0.0,1.0);
  Draw::PipelineCreateInfo::addState((PipelineCreateInfo *)local_3f0,&local_6a0);
  local_704 = 0xffffffff;
  std::allocator<unsigned_int>::allocator(&local_705);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_700,1,&local_704,&local_705);
  Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
            (&local_6e8,VK_SAMPLE_COUNT_1_BIT,0,0.0,&local_700,false,false);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_3f0,&local_6e8.super_VkPipelineMultisampleStateCreateInfo);
  Draw::PipelineCreateInfo::MultiSampleState::~MultiSampleState(&local_6e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_700);
  std::allocator<unsigned_int>::~allocator(&local_705);
  std::allocator<vk::VkDynamicState>::allocator(&local_759);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::vector
            (&local_758,0,&local_759);
  Draw::PipelineCreateInfo::DynamicState::DynamicState(&local_740,&local_758);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)local_3f0,&local_740.super_VkPipelineDynamicStateCreateInfo);
  Draw::PipelineCreateInfo::DynamicState::~DynamicState(&local_740);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::~vector(&local_758);
  std::allocator<vk::VkDynamicState>::~allocator(&local_759);
  pVVar2 = vs.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  pDVar1 = this->m_vk;
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_7a8,0);
  ::vk::createGraphicsPipeline
            (&local_7a0,pDVar1,(VkDevice)pVVar2,local_7a8,(VkGraphicsPipelineCreateInfo *)local_3f0,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_780,(Move *)&local_7a0);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_780.deleter.m_deviceIface;
  data_01.object.m_internal = local_780.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_780.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_780.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_780.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_780.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_780.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=(&this->m_pipeline,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_7a0);
  Draw::PipelineCreateInfo::~PipelineCreateInfo((PipelineCreateInfo *)local_3f0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_38);
  return;
}

Assistant:

void DynamicStateBaseClass::initPipeline (const vk::VkDevice device)
{
	const vk::Unique<vk::VkShaderModule> vs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_vertexShaderName), 0));
	const vk::Unique<vk::VkShaderModule> fs(createShaderModule(m_vk, device, m_context.getBinaryCollection().get(m_fragmentShaderName), 0));

	const PipelineCreateInfo::ColorBlendState::Attachment vkCbAttachmentState;

	PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, 0);
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", vk::VK_SHADER_STAGE_VERTEX_BIT));
	pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", vk::VK_SHADER_STAGE_FRAGMENT_BIT));
	pipelineCreateInfo.addState(PipelineCreateInfo::VertexInputState(m_vertexInputState));
	pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(m_topology));
	pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &vkCbAttachmentState));
	pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1));
	pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState());
	pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState());
	pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());
	pipelineCreateInfo.addState(PipelineCreateInfo::DynamicState());

	m_pipeline = vk::createGraphicsPipeline(m_vk, device, DE_NULL, &pipelineCreateInfo);
}